

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

Gia_Man_t * Str_NtkToGia(Gia_Man_t *pGia,Str_Ntk_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  int iVar8;
  uint uVar9;
  Gia_Man_t *p_00;
  size_t sVar10;
  char *pcVar11;
  Str_Obj_t *pSVar12;
  Gia_Obj_t *pGVar13;
  Gia_Man_t *pGVar14;
  Str_Obj_t *pSVar15;
  uint uVar16;
  
  if (pGia->pMuxes != (uint *)0x0) {
    __assert_fail("pGia->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0xb0,"Gia_Man_t *Str_NtkToGia(Gia_Man_t *, Str_Ntk_t *)");
  }
  p_00 = Gia_ManStart((pGia->nObjs * 3) / 2);
  pcVar4 = pGia->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar4);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar4);
  }
  p_00->pName = pcVar11;
  pcVar4 = pGia->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar4);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar4);
  }
  p_00->pSpec = pcVar11;
  Gia_ManHashStart(p_00);
  iVar8 = p->nObjs;
  if (0 < iVar8) {
    pSVar12 = p->pObjs;
    pSVar15 = pSVar12;
    do {
      switch(*(uint *)pSVar15 & 0xf) {
      case 1:
        iVar8 = 0;
        break;
      case 2:
        pGVar13 = Gia_ManAppendObj(p_00);
        uVar6 = *(ulong *)pGVar13;
        *(ulong *)pGVar13 = uVar6 | 0x9fffffff;
        *(ulong *)pGVar13 =
             uVar6 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar7 = p_00->pObjs;
        if ((pGVar13 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar13)) {
LAB_007d66ea:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar7) >> 2) * -0x55555555);
        pGVar7 = p_00->pObjs;
        if ((pGVar13 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar13)) goto LAB_007d66ea;
        iVar8 = (int)((ulong)((long)pGVar13 - (long)pGVar7) >> 2) * 0x55555556;
        break;
      case 3:
        pSVar15->iCopy = 1;
        if (0xf < *(uint *)pSVar15) {
          uVar16 = 0;
          do {
            uVar9 = pSVar15->iOffset + uVar16;
            if (((int)uVar9 < 0) || ((p->vFanins).nSize <= (int)uVar9)) goto LAB_007d666e;
            uVar9 = (p->vFanins).pArray[uVar9];
            if ((int)uVar9 < 0) goto LAB_007d66ac;
            if (p->nObjs <= (int)(uVar9 >> 1)) goto LAB_007d668d;
            uVar2 = p->pObjs[uVar9 >> 1].iCopy;
            if ((int)uVar2 < 0) goto LAB_007d66cb;
            iVar8 = Gia_ManHashAnd(p_00,pSVar15->iCopy,uVar2 ^ uVar9 & 1);
            pSVar15->iCopy = iVar8;
            uVar16 = uVar16 + 1;
          } while (uVar16 < *(uint *)pSVar15 >> 4);
        }
        goto LAB_007d6514;
      case 4:
        pSVar15->iCopy = 0;
        if (0xf < *(uint *)pSVar15) {
          uVar16 = 0;
          do {
            uVar9 = pSVar15->iOffset + uVar16;
            if (((int)uVar9 < 0) || ((p->vFanins).nSize <= (int)uVar9)) goto LAB_007d666e;
            uVar9 = (p->vFanins).pArray[uVar9];
            if ((int)uVar9 < 0) goto LAB_007d66ac;
            if (p->nObjs <= (int)(uVar9 >> 1)) goto LAB_007d668d;
            uVar2 = p->pObjs[uVar9 >> 1].iCopy;
            if ((int)uVar2 < 0) goto LAB_007d66cb;
            iVar8 = Gia_ManHashXor(p_00,pSVar15->iCopy,uVar2 ^ uVar9 & 1);
            pSVar15->iCopy = iVar8;
            uVar16 = uVar16 + 1;
          } while (uVar16 < *(uint *)pSVar15 >> 4);
        }
        goto LAB_007d6514;
      case 5:
        iVar3 = pSVar15->iOffset;
        if ((long)iVar3 < -2) {
LAB_007d666e:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = (p->vFanins).nSize;
        if (iVar1 <= (int)(iVar3 + 2U)) goto LAB_007d666e;
        piVar5 = (p->vFanins).pArray;
        uVar16 = piVar5[iVar3 + 2U];
        if ((int)uVar16 < 0) {
LAB_007d66ac:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (iVar8 <= (int)(uVar16 >> 1)) {
LAB_007d668d:
          __assert_fail("i < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                        ,0x52,"Str_Obj_t *Str_NtkObj(Str_Ntk_t *, int)");
        }
        if (pSVar12[uVar16 >> 1].iCopy < 0) {
LAB_007d66cb:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        if ((iVar3 == -2) || (iVar1 <= (int)(iVar3 + 1U))) goto LAB_007d666e;
        uVar9 = piVar5[iVar3 + 1U];
        if ((int)uVar9 < 0) goto LAB_007d66ac;
        if (iVar8 <= (int)(uVar9 >> 1)) goto LAB_007d668d;
        if (pSVar12[uVar9 >> 1].iCopy < 0) goto LAB_007d66cb;
        if ((iVar3 < 0) || (iVar1 <= iVar3)) goto LAB_007d666e;
        uVar2 = piVar5[iVar3];
        if ((int)uVar2 < 0) goto LAB_007d66ac;
        if (iVar8 <= (int)(uVar2 >> 1)) goto LAB_007d668d;
        if (pSVar12[uVar2 >> 1].iCopy < 0) goto LAB_007d66cb;
        iVar8 = Gia_ManHashMux(p_00,pSVar12[uVar16 >> 1].iCopy ^ uVar16 & 1,
                               pSVar12[uVar9 >> 1].iCopy ^ uVar9 & 1,
                               pSVar12[uVar2 >> 1].iCopy ^ uVar2 & 1);
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0xcb,"Gia_Man_t *Str_NtkToGia(Gia_Man_t *, Str_Ntk_t *)");
      case 7:
        iVar3 = pSVar15->iOffset;
        if (((long)iVar3 < 0) || ((p->vFanins).nSize <= iVar3)) goto LAB_007d666e;
        uVar16 = (p->vFanins).pArray[iVar3];
        if ((int)uVar16 < 0) goto LAB_007d66ac;
        if (iVar8 <= (int)(uVar16 >> 1)) goto LAB_007d668d;
        if (pSVar12[uVar16 >> 1].iCopy < 0) goto LAB_007d66cb;
        iVar8 = Gia_ManAppendCo(p_00,pSVar12[uVar16 >> 1].iCopy ^ uVar16 & 1);
      }
      pSVar15->iCopy = iVar8;
LAB_007d6514:
      pSVar15 = pSVar15 + 1;
      pSVar12 = p->pObjs;
      iVar8 = p->nObjs;
    } while ((int)((ulong)((long)pSVar15 - (long)pSVar12) >> 4) < iVar8);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,pGia->nRegs);
  pGVar14 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar14;
}

Assistant:

Gia_Man_t * Str_NtkToGia( Gia_Man_t * pGia, Str_Ntk_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Str_Obj_t * pObj; int k;
    assert( pGia->pMuxes == NULL );
    pNew = Gia_ManStart( 3 * Gia_ManObjNum(pGia) / 2 );
    pNew->pName = Abc_UtilStrsav( pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    Gia_ManHashStart( pNew );
    Str_NtkManForEachObj( p, pObj )
    {
        if ( pObj->Type == STR_PI )
            pObj->iCopy = Gia_ManAppendCi( pNew );
        else if ( pObj->Type == STR_AND )
        {
            pObj->iCopy = 1;
            for ( k = 0; k < (int)pObj->nFanins; k++ )
                pObj->iCopy = Gia_ManHashAnd( pNew, pObj->iCopy, Str_ObjFaninCopy(p, pObj, k) );
        }
        else if ( pObj->Type == STR_XOR )
        {
            pObj->iCopy = 0;
            for ( k = 0; k < (int)pObj->nFanins; k++ )
                pObj->iCopy = Gia_ManHashXor( pNew, pObj->iCopy, Str_ObjFaninCopy(p, pObj, k) );
        }
        else if ( pObj->Type == STR_MUX )
            pObj->iCopy = Gia_ManHashMux( pNew, Str_ObjFaninCopy(p, pObj, 2), Str_ObjFaninCopy(p, pObj, 1), Str_ObjFaninCopy(p, pObj, 0) );
        else if ( pObj->Type == STR_PO )
            pObj->iCopy = Gia_ManAppendCo( pNew, Str_ObjFaninCopy(p, pObj, 0) );
        else if ( pObj->Type == STR_CONST0 )
            pObj->iCopy = 0;
        else assert( 0 );
    }
    Gia_ManHashStop( pNew );
//    assert( Gia_ManObjNum(pNew) <= Gia_ManObjNum(pGia) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(pGia) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}